

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O3

int arkLsMassInitialize(void *arkode_mem)

{
  int iVar1;
  SUNLinearSolver_Type SVar2;
  SUNLinearSolver S;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_mem;
  ARKodeMem local_28;
  ARKLsMassMem local_20;
  
  iVar1 = arkLs_AccessMassMem(arkode_mem,"arkLsMassInitialize",&local_28,&local_20);
  if (iVar1 != 0) {
    return iVar1;
  }
  local_20->nli = 0;
  local_20->nps = 0;
  local_20->nmvsetup = 0;
  local_20->npe = 0;
  local_20->nmtsetup = 0;
  local_20->nmtimes = 0;
  local_20->nmsetups = 0;
  local_20->nmsolves = 0;
  local_20->ncfl = 0;
  local_20->msetuptime = -1.79769313486232e+308;
  if (local_20->M == (SUNMatrix)0x0) {
    if ((local_20->mtimes == (ARKLsMassTimesVecFn)0x0) &&
       (SVar2 = SUNLinSolGetType(local_20->LS), SVar2 != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      msgfmt = "Missing user-provided mass matrix-vector product routine";
    }
    else {
LAB_004d6a28:
      S = local_20->LS;
      if (S != (SUNLinearSolver)0x0) {
        if ((((local_20->M == (SUNMatrix)0x0) && (local_20->pset == (ARKLsMassPrecSetupFn)0x0)) &&
            (local_20->mtsetup == (ARKLsMassTimesSetupFn)0x0)) &&
           (local_28->step_disablemsetup != (ARKTimestepDisableMSetup)0x0)) {
          (*local_28->step_disablemsetup)(arkode_mem);
          S = local_20->LS;
        }
        SVar2 = SUNLinSolGetType(S);
        if (SVar2 == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
          (*local_28->step_disablemsetup)(arkode_mem);
        }
        iVar1 = SUNLinSolInitialize(local_20->LS);
        goto LAB_004d6af2;
      }
      msgfmt = "Missing SUNLinearSolver object";
    }
  }
  else if (local_20->mass == (ARKLsMassFn)0x0) {
    msgfmt = "Missing user-provided mass-matrix routine";
  }
  else {
    if ((local_20->mtimes != (ARKLsMassTimesVecFn)0x0) ||
       (local_20->M->ops->matvec != (_func_int_SUNMatrix_N_Vector_N_Vector *)0x0))
    goto LAB_004d6a28;
    msgfmt = "No available mass matrix-vector product routine";
  }
  iVar1 = -3;
  arkProcessError(local_28,-3,"ARKLS","arkLsMassInitialize",msgfmt);
LAB_004d6af2:
  local_20->last_flag = iVar1;
  return iVar1;
}

Assistant:

int arkLsMassInitialize(void *arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMassMem arkls_mem;
  int          retval;

  /* access ARKLsMassMem structure */
  retval = arkLs_AccessMassMem(arkode_mem, "arkLsMassInitialize",
                               &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* reset counters */
  arkLsInitializeMassCounters(arkls_mem);

  /* perform checks for matrix-based mass system */
  if (arkls_mem->M != NULL) {
    /* check for user-provided mass matrix constructor */
    if (arkls_mem->mass == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLsMassInitialize",
                      "Missing user-provided mass-matrix routine");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(arkls_mem->last_flag);
    }
    /* check that someone can perform matrix-vector product */
    if ((arkls_mem->mtimes == NULL) && (arkls_mem->M->ops->matvec == NULL)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLsMassInitialize",
                      "No available mass matrix-vector product routine");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(arkls_mem->last_flag);
    }
  }

  /* perform checks for matrix-free mass system */
  if ((arkls_mem->M == NULL) && (arkls_mem->mtimes == NULL) &&
      (SUNLinSolGetType(arkls_mem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsMassInitialize",
                    "Missing user-provided mass matrix-vector product routine");
    arkls_mem->last_flag = ARKLS_ILL_INPUT;
    return(arkls_mem->last_flag);
  }

  /* ensure that a mass matrix solver exists */
  if (arkls_mem->LS == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLsMassInitialize",
                    "Missing SUNLinearSolver object");
    arkls_mem->last_flag = ARKLS_ILL_INPUT;
    return(arkls_mem->last_flag);
  }

  /* if M is NULL and neither pset or mtsetup are present, then
     arkLsMassSetup does not need to be called, so set the
     msetup function to NULL */
  if ( (arkls_mem->M == NULL) &&
       (arkls_mem->pset == NULL) &&
       (arkls_mem->mtsetup == NULL) &&
       (ark_mem->step_disablemsetup != NULL) )
    ark_mem->step_disablemsetup(arkode_mem);

  /* When using a matrix-embedded linear solver, disable lsetup call */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)
    ark_mem->step_disablemsetup(arkode_mem);

  /* Call LS initialize routine */
  arkls_mem->last_flag = SUNLinSolInitialize(arkls_mem->LS);
  return(arkls_mem->last_flag);
}